

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

Vec_Wrd_t * Mf_ManTruthCollect(int Limit)

{
  ulong uVar1;
  byte bVar2;
  int *__ptr;
  int *__ptr_00;
  Vec_Wrd_t *pVVar3;
  Vec_Wrd_t *pVVar4;
  word *pwVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  size_t __size;
  long lVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  word uTruth;
  ulong local_80;
  uint local_74;
  long local_70;
  ulong local_68;
  Vec_Wrd_t *local_60;
  long local_58;
  ulong local_50;
  int *local_48;
  long local_40;
  ulong local_38;
  
  __ptr = Extra_PermSchedule(6);
  __ptr_00 = Extra_GreyCodeSchedule(6);
  pVVar3 = Mpm_ManGetTruthWithCnf(Limit);
  pVVar4 = (Vec_Wrd_t *)malloc(0x10);
  pVVar4->nCap = 0x100000;
  pVVar4->nSize = 0;
  pwVar5 = (word *)malloc(0x800000);
  pVVar4->pArray = pwVar5;
  if (pVVar3->nSize < 1) {
    iVar14 = 0;
    if (__ptr == (int *)0x0) goto LAB_00779006;
  }
  else {
    iVar10 = 0x100000;
    lVar9 = 0;
    lVar13 = 0;
    local_60 = pVVar3;
    local_48 = __ptr;
    do {
      local_80 = local_60->pArray[lVar9];
      uVar6 = CONCAT71((int7)(local_80 >> 8),1);
      uVar7 = 0;
      local_58 = lVar9;
      do {
        local_74 = (uint)uVar6;
        uVar7 = uVar7 ^ local_80;
        lVar9 = 0;
        local_50 = uVar7;
        do {
          lVar12 = lVar13;
          lVar13 = (long)(int)lVar12;
          iVar14 = (int)lVar12 * 2;
          __size = lVar13 << 4;
          lVar8 = 0;
          local_70 = lVar12;
          local_40 = lVar9;
          local_38 = uVar7;
          do {
            uVar1 = s_Truths6[__ptr_00[lVar8]];
            bVar2 = (byte)(1L << ((byte)__ptr_00[lVar8] & 0x3f));
            uVar11 = uVar1;
            if ((int)lVar12 + (int)lVar8 == iVar10) {
              local_68 = uVar1;
              if (lVar13 < 0x10) {
                if (pwVar5 == (word *)0x0) {
                  pwVar5 = (word *)malloc(0x80);
                }
                else {
                  pwVar5 = (word *)realloc(pwVar5,0x80);
                }
                pVVar4->pArray = pwVar5;
                iVar10 = 0x10;
              }
              else {
                if (pwVar5 == (word *)0x0) {
                  pwVar5 = (word *)malloc(__size);
                }
                else {
                  pwVar5 = (word *)realloc(pwVar5,__size);
                }
                pVVar4->pArray = pwVar5;
                iVar10 = iVar14;
              }
              uVar11 = local_68;
              lVar12 = local_70;
              if (pwVar5 == (word *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                              ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
              }
            }
            uVar7 = uVar7 << (bVar2 & 0x3f) & uVar11 | (uVar1 & uVar7) >> (bVar2 & 0x3f);
            pwVar5[lVar13] = uVar7;
            lVar13 = lVar13 + 1;
            lVar8 = lVar8 + 1;
            iVar14 = iVar14 + 2;
            __size = __size + 0x10;
          } while (lVar8 != 0x40);
          if (local_38 != uVar7) {
            __assert_fail("tTemp2 == tCur",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                          ,0xad,"Vec_Wrd_t *Mf_ManTruthCollect(int)");
          }
          iVar14 = local_48[local_40];
          bVar2 = (byte)(1L << ((byte)iVar14 & 0x3f));
          uVar7 = (local_38 & s_PMasks[iVar14][2]) >> (bVar2 & 0x3f) |
                  (s_PMasks[iVar14][1] & local_38) << (bVar2 & 0x3f) |
                  s_PMasks[iVar14][0] & local_38;
          lVar9 = local_40 + 1;
        } while (lVar9 != 0x2d0);
        if (local_50 != uVar7) {
          __assert_fail("tTemp1 == tCur",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                        ,0xb0,"Vec_Wrd_t *Mf_ManTruthCollect(int)");
        }
        uVar7 = 0xffffffffffffffff;
        uVar6 = 0;
      } while ((local_74 & 1) != 0);
      lVar9 = local_58 + 1;
    } while (lVar9 < local_60->nSize);
    iVar14 = (int)lVar12 + 0x40;
    pVVar4->nSize = iVar14;
    pVVar4->nCap = iVar10;
    pVVar3 = local_60;
    __ptr = local_48;
  }
  free(__ptr);
LAB_00779006:
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  printf("Original = %d.  ",(ulong)(uint)pVVar3->nSize);
  if (pVVar3->pArray != (word *)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  printf("Total = %d.  ");
  pVVar3 = Vec_WrdUniqifyHash(pVVar4,iVar14);
  if (pVVar4->pArray != (word *)0x0) {
    free(pVVar4->pArray);
  }
  free(pVVar4);
  iVar14 = pVVar3->nSize;
  lVar13 = (long)iVar14;
  printf("Unique = %d.  ");
  if (0 < lVar13) {
    pwVar5 = pVVar3->pArray;
    lVar9 = 0;
    do {
      local_80 = pwVar5[lVar9];
      iVar14 = 6;
      Mf_ManTruthCanonicize(&local_80,6);
      pwVar5[lVar9] = local_80;
      lVar9 = lVar9 + 1;
    } while (lVar13 != lVar9);
  }
  pVVar4 = Vec_WrdUniqifyHash(pVVar3,iVar14);
  if (pVVar3->pArray != (word *)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  printf("Unique = %d.  \n",(ulong)(uint)pVVar4->nSize);
  return pVVar4;
}

Assistant:

Vec_Wrd_t * Mf_ManTruthCollect( int Limit )
{
    extern Vec_Wrd_t * Mpm_ManGetTruthWithCnf( int Limit );
    int * pPerm = Extra_PermSchedule( 6 );
    int * pComp = Extra_GreyCodeSchedule( 6 );
    Vec_Wrd_t * vTruths = Mpm_ManGetTruthWithCnf( Limit );
    Vec_Wrd_t * vResult = Vec_WrdAlloc( 1 << 20 );
    word uTruth, tCur, tTemp1, tTemp2;
    int i, p, c, k;
    Vec_WrdForEachEntry( vTruths, uTruth, k )
    {
        for ( i = 0; i < 2; i++ )
        {
            tCur = i ? ~uTruth : uTruth;
            tTemp1 = tCur;
            for ( p = 0; p < 720; p++ )
            {
                tTemp2 = tCur;
                for ( c = 0; c < 64; c++ )
                {
                    tCur = Abc_Tt6Flip( tCur, pComp[c] );
                    Vec_WrdPush( vResult, tCur );
                }
                assert( tTemp2 == tCur );
                tCur = Abc_Tt6SwapAdjacent( tCur, pPerm[p] );
            }
            assert( tTemp1 == tCur );
        }
    }
    ABC_FREE( pPerm );
    ABC_FREE( pComp );
    printf( "Original = %d.  ", Vec_WrdSize(vTruths) );
    Vec_WrdFree( vTruths );
    printf( "Total = %d.  ", Vec_WrdSize(vResult) );
    vTruths = Vec_WrdUniqifyHash( vResult, 1 );
    Vec_WrdFree( vResult );
    printf( "Unique = %d.  ", Vec_WrdSize(vTruths) );
    Vec_WrdForEachEntry( vTruths, uTruth, k )
    {
        Mf_ManTruthCanonicize( &uTruth, 6 );
        Vec_WrdWriteEntry( vTruths, k, uTruth );
    }
    vResult = Vec_WrdUniqifyHash( vTruths, 1 );
    Vec_WrdFree( vTruths );
    printf( "Unique = %d.  \n", Vec_WrdSize(vResult) );
    return vResult;
}